

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::InsertEdgeIntoAEL(Clipper *this,TEdge *edge,TEdge *startEdge)

{
  bool bVar1;
  _func_int **pp_Var2;
  TEdge *pTVar3;
  TEdge **ppTVar4;
  
  pp_Var2 = this->_vptr_Clipper;
  if (*(TEdge **)
       (pp_Var2[-3] + 0x10 +
       (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) ==
      (TEdge *)0x0) {
    edge->NextInAEL = (TEdge *)0x0;
    edge->PrevInAEL = (TEdge *)0x0;
LAB_0027c5fe:
    ppTVar4 = (TEdge **)
              (pp_Var2[-3] + 0x10 +
              (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
  }
  else {
    if (startEdge == (TEdge *)0x0) {
      bVar1 = E2InsertsBeforeE1(*(TEdge **)
                                 (pp_Var2[-3] + 0x10 +
                                 (long)&(this->m_Maxima).
                                        super__List_base<long_long,_std::allocator<long_long>_>),
                                edge);
      if (bVar1) {
        edge->PrevInAEL = (TEdge *)0x0;
        pp_Var2 = this->_vptr_Clipper;
        edge->NextInAEL =
             *(TEdge **)
              (pp_Var2[-3] + 0x10 +
              (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
        *(TEdge **)
         (*(long *)(pp_Var2[-3] + 0x10 +
                   (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>)
         + 0x70) = edge;
        goto LAB_0027c5fe;
      }
      startEdge = *(TEdge **)
                   (this->_vptr_Clipper[-3] + 0x10 +
                   (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
    }
    do {
      pTVar3 = startEdge;
      ppTVar4 = &pTVar3->NextInAEL;
      if (pTVar3->NextInAEL == (TEdge *)0x0) {
        startEdge = (TEdge *)0x0;
        break;
      }
      bVar1 = E2InsertsBeforeE1(pTVar3->NextInAEL,edge);
      startEdge = *ppTVar4;
    } while (!bVar1);
    edge->NextInAEL = startEdge;
    if (*ppTVar4 != (TEdge *)0x0) {
      (*ppTVar4)->PrevInAEL = edge;
    }
    edge->PrevInAEL = pTVar3;
  }
  *ppTVar4 = edge;
  return;
}

Assistant:

void Clipper::InsertEdgeIntoAEL(TEdge *edge, TEdge* startEdge)
{
  if(!m_ActiveEdges)
  {
    edge->PrevInAEL = 0;
    edge->NextInAEL = 0;
    m_ActiveEdges = edge;
  }
  else if(!startEdge && E2InsertsBeforeE1(*m_ActiveEdges, *edge))
  {
      edge->PrevInAEL = 0;
      edge->NextInAEL = m_ActiveEdges;
      m_ActiveEdges->PrevInAEL = edge;
      m_ActiveEdges = edge;
  } 
  else
  {
    if(!startEdge) startEdge = m_ActiveEdges;
    while(startEdge->NextInAEL  && 
      !E2InsertsBeforeE1(*startEdge->NextInAEL , *edge))
        startEdge = startEdge->NextInAEL;
    edge->NextInAEL = startEdge->NextInAEL;
    if(startEdge->NextInAEL) startEdge->NextInAEL->PrevInAEL = edge;
    edge->PrevInAEL = startEdge;
    startEdge->NextInAEL = edge;
  }
}